

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint HuffmanTree_makeFromLengths2(HuffmanTree *tree)

{
  uint *puVar1;
  undefined1 auVar2 [16];
  undefined8 __ptr;
  uint uVar3;
  uint *puVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  int iVar14;
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  int iVar19;
  undefined1 local_68 [16];
  size_t local_58;
  undefined1 local_48 [16];
  size_t local_38;
  long lVar16;
  
  local_48 = (undefined1  [16])0x0;
  local_38 = 0;
  local_68 = (undefined1  [16])0x0;
  local_58 = 0;
  puVar4 = (uint *)malloc((ulong)tree->numcodes << 2);
  tree->tree1d = puVar4;
  uVar6 = (ulong)(tree->maxbitlen + 1);
  uVar3 = uivector_resize((uivector *)local_48,uVar6);
  if (uVar3 != 0) {
    if (uVar6 != 0) {
      memset((void *)local_48._0_8_,0,uVar6 << 2);
    }
    uVar6 = (ulong)(tree->maxbitlen + 1);
    uVar3 = uivector_resize((uivector *)local_68,uVar6);
    if (uVar3 != 0) {
      if (uVar6 != 0) {
        memset((void *)local_68._0_8_,0,uVar6 << 2);
      }
      if (puVar4 != (uint *)0x0) {
        if (tree->numcodes == 0) {
          uVar6 = 0;
        }
        else {
          puVar4 = tree->lengths;
          uVar7 = 0;
          do {
            *(uint *)(local_48._0_8_ + (ulong)puVar4[uVar7] * 4) =
                 *(uint *)(local_48._0_8_ + (ulong)puVar4[uVar7] * 4) + 1;
            uVar7 = uVar7 + 1;
            uVar6 = (ulong)tree->numcodes;
          } while (uVar7 < uVar6);
        }
        __ptr = local_68._0_8_;
        if (tree->maxbitlen != 0) {
          uVar3 = *(uint *)local_68._0_8_;
          uVar6 = 1;
          do {
            uVar3 = (uVar3 + *(uint *)(local_48._0_8_ + (ulong)((int)uVar6 - 1) * 4)) * 2;
            *(uint *)(local_68._0_8_ + uVar6 * 4) = uVar3;
            uVar5 = (int)uVar6 + 1;
            uVar6 = (ulong)uVar5;
          } while (uVar5 <= tree->maxbitlen);
          uVar6 = (ulong)tree->numcodes;
        }
        if ((int)uVar6 != 0) {
          puVar4 = tree->lengths;
          uVar7 = 0;
          do {
            uVar8 = (ulong)puVar4[uVar7];
            if (uVar8 != 0) {
              uVar3 = *(uint *)(local_68._0_8_ + uVar8 * 4);
              *(uint *)(local_68._0_8_ + uVar8 * 4) = uVar3 + 1;
              tree->tree1d[uVar7] = uVar3;
              uVar6 = (ulong)tree->numcodes;
            }
            uVar7 = uVar7 + 1;
          } while (uVar7 < uVar6);
        }
        free((void *)local_48._0_8_);
        free((void *)__ptr);
        uVar3 = tree->numcodes;
        uVar6 = (ulong)(uVar3 * 2);
        puVar4 = (uint *)malloc(uVar6 * 4);
        tree->tree2d = puVar4;
        auVar2 = _DAT_00112130;
        if (puVar4 == (uint *)0x0) {
          return 0x53;
        }
        if (uVar6 != 0) {
          lVar16 = uVar6 - 1;
          auVar13._8_4_ = (int)lVar16;
          auVar13._0_8_ = lVar16;
          auVar13._12_4_ = (int)((ulong)lVar16 >> 0x20);
          uVar7 = 0;
          auVar13 = auVar13 ^ _DAT_00112130;
          auVar15 = _DAT_00112110;
          auVar17 = _DAT_00112120;
          do {
            auVar18 = auVar17 ^ auVar2;
            iVar14 = auVar13._4_4_;
            if ((bool)(~(auVar18._4_4_ == iVar14 && auVar13._0_4_ < auVar18._0_4_ ||
                        iVar14 < auVar18._4_4_) & 1)) {
              puVar4[uVar7] = 0x7fff;
            }
            if ((auVar18._12_4_ != auVar13._12_4_ || auVar18._8_4_ <= auVar13._8_4_) &&
                auVar18._12_4_ <= auVar13._12_4_) {
              puVar4[uVar7 + 1] = 0x7fff;
            }
            auVar18 = auVar15 ^ auVar2;
            iVar19 = auVar18._4_4_;
            if (iVar19 <= iVar14 && (iVar19 != iVar14 || auVar18._0_4_ <= auVar13._0_4_)) {
              puVar4[uVar7 + 2] = 0x7fff;
              puVar4[uVar7 + 3] = 0x7fff;
            }
            uVar7 = uVar7 + 4;
            lVar16 = auVar17._8_8_;
            auVar17._0_8_ = auVar17._0_8_ + 4;
            auVar17._8_8_ = lVar16 + 4;
            lVar16 = auVar15._8_8_;
            auVar15._0_8_ = auVar15._0_8_ + 4;
            auVar15._8_8_ = lVar16 + 4;
          } while ((uVar6 + 3 & 0xfffffffffffffffc) != uVar7);
        }
        if ((ulong)uVar3 != 0) {
          puVar1 = tree->lengths;
          uVar7 = 0;
          uVar9 = 0;
          uVar5 = 0;
          do {
            uVar10 = puVar1[uVar7];
            if (uVar10 != 0) {
              uVar11 = 0;
              do {
                if (uVar3 - 2 < uVar9) {
                  return 0x37;
                }
                uVar12 = (uint)((tree->tree1d[uVar7] >> (~uVar11 + uVar10 & 0x1f) & 1) != 0) +
                         uVar9 * 2;
                if (puVar4[uVar12] == 0x7fff) {
                  uVar11 = uVar11 + 1;
                  if (uVar11 == uVar10) {
                    puVar4[uVar12] = (uint)uVar7;
                    uVar9 = 0;
                    uVar11 = uVar10;
                  }
                  else {
                    uVar9 = uVar5 + 1;
                    puVar4[uVar12] = uVar5 + uVar3 + 1;
                    uVar5 = uVar9;
                  }
                }
                else {
                  uVar9 = puVar4[uVar12] - uVar3;
                  uVar11 = uVar11 + 1;
                }
                uVar10 = puVar1[uVar7];
              } while (uVar11 < uVar10);
            }
            uVar7 = uVar7 + 1;
          } while (uVar7 != uVar3);
          if (uVar3 * 2 != 0) {
            uVar7 = 0;
            do {
              if (puVar4[uVar7] == 0x7fff) {
                puVar4[uVar7] = 0;
              }
              uVar7 = uVar7 + 1;
            } while (uVar6 != uVar7);
            return 0;
          }
        }
        return 0;
      }
    }
  }
  free((void *)local_48._0_8_);
  free((void *)local_68._0_8_);
  return 0x53;
}

Assistant:

static unsigned HuffmanTree_makeFromLengths2(HuffmanTree* tree)
{
  uivector blcount;
  uivector nextcode;
  unsigned bits, n, error = 0;

  uivector_init(&blcount);
  uivector_init(&nextcode);

  tree->tree1d = (unsigned*)lodepng_malloc(tree->numcodes * sizeof(unsigned));
  if(!tree->tree1d) error = 83; /*alloc fail*/

  if(!uivector_resizev(&blcount, tree->maxbitlen + 1, 0)
  || !uivector_resizev(&nextcode, tree->maxbitlen + 1, 0))
    error = 83; /*alloc fail*/

  if(!error)
  {
    /*step 1: count number of instances of each code length*/
    for(bits = 0; bits < tree->numcodes; bits++) blcount.data[tree->lengths[bits]]++;
    /*step 2: generate the nextcode values*/
    for(bits = 1; bits <= tree->maxbitlen; bits++)
    {
      nextcode.data[bits] = (nextcode.data[bits - 1] + blcount.data[bits - 1]) << 1;
    }
    /*step 3: generate all the codes*/
    for(n = 0; n < tree->numcodes; n++)
    {
      if(tree->lengths[n] != 0) tree->tree1d[n] = nextcode.data[tree->lengths[n]]++;
    }
  }

  uivector_cleanup(&blcount);
  uivector_cleanup(&nextcode);

  if(!error) return HuffmanTree_make2DTree(tree);
  else return error;
}